

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryCopyExpr
          (BinaryReaderIR *this,Index srcmemidx,Index destmemidx)

{
  Result RVar1;
  pointer *__ptr;
  undefined1 local_108 [80];
  Var local_b8;
  Var local_70;
  
  GetLocation((Location *)(local_108 + 0x30),this);
  Var::Var(&local_70,srcmemidx,(Location *)(local_108 + 0x30));
  GetLocation((Location *)(local_108 + 0x10),this);
  Var::Var(&local_b8,destmemidx,(Location *)(local_108 + 0x10));
  std::make_unique<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,wabt::Var,wabt::Var>
            ((Var *)local_108,&local_70);
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = (long *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                          (local_108 + 8));
  if ((long *)local_108._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_108._8_8_ + 8))();
  }
  if ((long *)local_108._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_108._0_8_ + 8))();
  }
  local_108._0_8_ = 0;
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnMemoryCopyExpr(Index srcmemidx, Index destmemidx) {
  return AppendExpr(std::make_unique<MemoryCopyExpr>(
      Var(srcmemidx, GetLocation()), Var(destmemidx, GetLocation())));
}